

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O1

CVmFmtTabStop * CVmFmtTabStop::find(CVmHashTable *hashtab,wchar_t *id,int create)

{
  long lVar1;
  void *pvVar2;
  size_t sVar3;
  wchar_t *dst;
  size_t sVar4;
  CVmHashEntry *this;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  dst = (wchar_t *)0x0;
  sVar3 = fold_case((wchar_t *)0x0,id);
  if (sVar3 != 0) {
    dst = (wchar_t *)operator_new__(-(ulong)(sVar3 + 1 >> 0x3e != 0) | sVar3 * 4 + 4);
  }
  G_err_frame::__tls_init();
  local_108 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  if (local_110[0] == 0) {
    if (dst != (wchar_t *)0x0) {
      fold_case(dst,id);
      id = dst;
    }
    sVar4 = wcslen(id);
    this = CVmHashTable::find(hashtab,(char *)id,sVar4 << 2);
    if ((create != 0) && (this == (CVmHashEntry *)0x0)) {
      this = (CVmHashEntry *)operator_new(0x28);
      CVmHashEntry::CVmHashEntry(this,(char *)id,sVar4 << 2,1);
      this->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00369f30;
      *(undefined4 *)&this->field_0x24 = 0;
      CVmHashTable::add(hashtab,this);
    }
  }
  else {
    this = (CVmHashEntry *)0x0;
  }
  if ((-1 < (short)local_110[0]) && (local_110[0] = local_110[0] | 0x8000, dst != (wchar_t *)0x0)) {
    operator_delete__(dst);
  }
  lVar1 = local_108;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_110[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_100;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return (CVmFmtTabStop *)this;
}

Assistant:

static CVmFmtTabStop *find(CVmHashTable *hashtab, wchar_t *id, int create)
    {
        /* 
         *   Get the length - in characters AND in bytes - of the new ID.
         *   We mostly work with the new ID in bytes rather than wchar_t's,
         *   because the underlying hash table does everything in bytes.  
         */
        
        /* 
         *   Convert the new ID to folded case.  The hash table doesn't deal
         *   with unicode case conversions, so we use a case-sensitive hash
         *   table and simply make sure we only give it lower-case
         *   characters.  
         */
        size_t flen = fold_case(0, id);
        wchar_t *fid = 0;
        if (flen != 0)
            fid = new wchar_t[flen+1];

        CVmFmtTabStop *entry = 0;
        err_try
        {
            /* do the folding if applicable */
            if (fid != 0)
            {
                fold_case(fid, id);
                id = fid;
            }

            /* get the folded ID length in characters and bytes */
            size_t id_chars = wcslen(id);
            size_t id_bytes = id_chars * sizeof(wchar_t);
            
            /* look for an existing tab-stop entry with the same ID */
            entry = (CVmFmtTabStop *)hashtab->find((char *)id, id_bytes);
            
            /* if we didn't find it, and they want to create it, do so */
            if (entry == 0 && create)
                hashtab->add(entry = new CVmFmtTabStop((char *)id, id_bytes));
        }